

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::(anonymous_namespace)::CEscapeInternal_abi_cxx11_
          (string *__return_storage_ptr__,void *this,string_view src,bool use_hex,bool utf8_safe)

{
  byte c_00;
  bool bVar1;
  bool bVar2;
  const_iterator pvVar3;
  char cVar4;
  uchar uc;
  bool local_42;
  bool is_hex_escape;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  undefined1 auStack_20 [4];
  bool last_hex_escape;
  bool utf8_safe_local;
  bool use_hex_local;
  string_view src_local;
  string *dest;
  
  src_local._M_len = src._M_len;
  _auStack_20 = this;
  src_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_42 = false;
  __end2 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  for (; __end2 != pvVar3; __end2 = __end2 + 1) {
    c_00 = *__end2;
    bVar1 = false;
    if (c_00 == 9) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      local_42 = bVar1;
    }
    else if (c_00 == 10) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      local_42 = bVar1;
    }
    else if (c_00 == 0xd) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      local_42 = bVar1;
    }
    else if (c_00 == 0x22) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      local_42 = bVar1;
    }
    else if (c_00 == 0x27) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      local_42 = bVar1;
    }
    else if (c_00 == 0x5c) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      local_42 = bVar1;
    }
    else {
      cVar4 = (char)__return_storage_ptr__;
      if (((use_hex) && (0x7f < c_00)) ||
         ((bVar2 = ascii_isprint(c_00), bVar2 &&
          ((!local_42 || (bVar2 = ascii_isxdigit(c_00), !bVar2)))))) {
        std::__cxx11::string::push_back(cVar4);
        local_42 = bVar1;
      }
      else {
        local_42 = ((undefined1  [16])src & (undefined1  [16])0x1) == (undefined1  [16])0x0;
        if (local_42) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::__cxx11::string::push_back(cVar4);
          std::__cxx11::string::push_back(cVar4);
          std::__cxx11::string::push_back(cVar4);
        }
        else {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::__cxx11::string::push_back(cVar4);
          std::__cxx11::string::push_back(cVar4);
        }
        local_42 = !local_42;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CEscapeInternal(absl::string_view src, bool use_hex,
                            bool utf8_safe) {
  std::string dest;
  bool last_hex_escape = false;  // true if last output char was \xNN.

  for (char c : src) {
    bool is_hex_escape = false;
    switch (c) {
      case '\n': dest.append("\\" "n"); break;
      case '\r': dest.append("\\" "r"); break;
      case '\t': dest.append("\\" "t"); break;
      case '\"': dest.append("\\" "\""); break;
      case '\'': dest.append("\\" "'"); break;
      case '\\': dest.append("\\" "\\"); break;
      default: {
        // Note that if we emit \xNN and the src character after that is a hex
        // digit then that digit must be escaped too to prevent it being
        // interpreted as part of the character code by C.
        const unsigned char uc = static_cast<unsigned char>(c);
        if ((!utf8_safe || uc < 0x80) &&
            (!absl::ascii_isprint(uc) ||
             (last_hex_escape && absl::ascii_isxdigit(uc)))) {
          if (use_hex) {
            dest.append("\\" "x");
            dest.push_back(numbers_internal::kHexChar[uc / 16]);
            dest.push_back(numbers_internal::kHexChar[uc % 16]);
            is_hex_escape = true;
          } else {
            dest.append("\\");
            dest.push_back(numbers_internal::kHexChar[uc / 64]);
            dest.push_back(numbers_internal::kHexChar[(uc % 64) / 8]);
            dest.push_back(numbers_internal::kHexChar[uc % 8]);
          }
        } else {
          dest.push_back(c);
          break;
        }
      }
    }
    last_hex_escape = is_hex_escape;
  }

  return dest;
}